

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::Flatten
          (MessageGenerator *this,
          vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
          *list)

{
  pointer *pppMVar1;
  iterator __position;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar2;
  long i;
  MessageGenerator *local_28;
  
  if (0 < *(int *)(this->descriptor_ + 0x48)) {
    i = 0;
    do {
      psVar2 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->nested_generators_,i);
      if (psVar2->ptr_ == (MessageGenerator *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cpp::MessageGenerator]"
                     );
      }
      Flatten(psVar2->ptr_,list);
      i = i + 1;
    } while (i < *(int *)(this->descriptor_ + 0x48));
  }
  __position._M_current =
       (list->
       super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  this->index_in_file_messages_ =
       (int)((ulong)((long)__position._M_current -
                    (long)(list->
                          super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (__position._M_current ==
      (list->
      super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_28 = this;
    std::
    vector<google::protobuf::compiler::cpp::MessageGenerator*,std::allocator<google::protobuf::compiler::cpp::MessageGenerator*>>
    ::_M_realloc_insert<google::protobuf::compiler::cpp::MessageGenerator*>
              ((vector<google::protobuf::compiler::cpp::MessageGenerator*,std::allocator<google::protobuf::compiler::cpp::MessageGenerator*>>
                *)list,__position,&local_28);
  }
  else {
    *__position._M_current = this;
    pppMVar1 = &(list->
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    *pppMVar1 = *pppMVar1 + 1;
  }
  return;
}

Assistant:

void MessageGenerator::Flatten(std::vector<MessageGenerator*>* list) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->Flatten(list);
  }
  index_in_file_messages_ = list->size();
  list->push_back(this);
}